

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaStr.c
# Opt level: O0

int Str_MuxRestructAreaThree(Gia_Man_t *pNew,Str_Mux_t *pMux,Vec_Int_t *vDelay,int fVerbose)

{
  int Lit;
  int iObj;
  Str_Mux_t *pSVar1;
  Str_Mux_t *pSVar2;
  Str_Mux_t *pFanin1;
  Str_Mux_t *pFanin0;
  int iRes;
  int fVerbose_local;
  Vec_Int_t *vDelay_local;
  Str_Mux_t *pMux_local;
  Gia_Man_t *pNew_local;
  
  pSVar1 = Str_MuxFanin(pMux,0);
  pSVar2 = Str_MuxFanin(pMux,1);
  if (pMux->Copy != -1) {
    __assert_fail("pMux->Copy == -1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaStr.c"
                  ,0x6ee,"int Str_MuxRestructAreaThree(Gia_Man_t *, Str_Mux_t *, Vec_Int_t *, int)")
    ;
  }
  pMux->Copy = -2;
  if (pSVar1->Edge[2].Copy != pSVar2->Edge[2].Copy) {
    Lit = Gia_ManHashMuxReal(pNew,pMux->Edge[2].Copy,pSVar2->Edge[2].Copy,pSVar1->Edge[2].Copy);
    iObj = Abc_Lit2Var(Lit);
    Str_ObjDelay(pNew,iObj,pMux->nLutSize,vDelay);
    pSVar2->Edge[2].Copy = Lit;
    pSVar1->Edge[2].Copy = Lit;
  }
  return 0;
}

Assistant:

int Str_MuxRestructAreaThree( Gia_Man_t * pNew, Str_Mux_t * pMux, Vec_Int_t * vDelay, int fVerbose )
{
    int iRes;
    Str_Mux_t * pFanin0 = Str_MuxFanin( pMux, 0 );
    Str_Mux_t * pFanin1 = Str_MuxFanin( pMux, 1 );
    assert( pMux->Copy == -1 );
    pMux->Copy = -2;
    if ( pFanin0->Edge[2].Copy == pFanin1->Edge[2].Copy )
        return 0;
    iRes = Gia_ManHashMuxReal( pNew, pMux->Edge[2].Copy, pFanin1->Edge[2].Copy, pFanin0->Edge[2].Copy );
    Str_ObjDelay( pNew, Abc_Lit2Var(iRes), pMux->nLutSize, vDelay );
    pFanin0->Edge[2].Copy = pFanin1->Edge[2].Copy = iRes;
//    printf( "Created triple\n" );
    return 0;
}